

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O2

void __thiscall ASDCP::ATMOS::MXFReader::~MXFReader(MXFReader *this)

{
  h__Reader *phVar1;
  char cVar2;
  
  this->_vptr_MXFReader = (_func_int **)&PTR__MXFReader_0021a440;
  phVar1 = (this->m_Reader).m_p;
  if (phVar1 != (h__Reader *)0x0) {
    cVar2 = (**(code **)(*(long *)(phVar1->super_h__ASDCPReader).
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                                  .m_File + 0x40))();
    if (cVar2 != '\0') {
      MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>::Close
                ((TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *)
                 (this->m_Reader).m_p);
    }
    phVar1 = (this->m_Reader).m_p;
    if (phVar1 != (h__Reader *)0x0) {
      (*(phVar1->super_h__ASDCPReader).
        super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>.
        _vptr_TrackFileReader[1])();
      return;
    }
  }
  return;
}

Assistant:

ASDCP::ATMOS::MXFReader::~MXFReader()
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    m_Reader->Close();
}